

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ContinuousAssignSyntax::ContinuousAssignSyntax
          (ContinuousAssignSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token assign,
          DriveStrengthSyntax *strength,TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *assignments,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  iterator __begin2;
  
  uVar5 = assign._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ContinuousAssign,attributes);
  (this->assign).kind = (short)uVar5;
  (this->assign).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->assign).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->assign).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->assign).info = assign.info;
  this->strength = strength;
  this->delay = delay;
  uVar3 = *(undefined4 *)&(assignments->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (assignments->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->assignments).super_SyntaxListBase.super_SyntaxNode.kind =
       (assignments->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->assignments).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->assignments).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->assignments).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (assignments->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->assignments).super_SyntaxListBase.childCount =
       (assignments->super_SyntaxListBase).childCount;
  (this->assignments).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006a38f0;
  sVar1 = (assignments->elements)._M_extent._M_extent_value;
  (this->assignments).elements._M_ptr = (assignments->elements)._M_ptr;
  (this->assignments).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (strength != (DriveStrengthSyntax *)0x0) {
    (strength->super_NetStrengthSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  }
  if (delay != (TimingControlSyntax *)0x0) {
    (delay->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->assignments).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __begin2.index = 0;
  sVar1 = (this->assignments).elements._M_extent._M_extent_value;
  __begin2.list = &this->assignments;
  for (; (__begin2.list != &this->assignments || (__begin2.index != sVar1 + 1 >> 1));
      __begin2.index = __begin2.index + 1) {
    pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::dereference(&__begin2);
    (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ContinuousAssignSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token assign, DriveStrengthSyntax* strength, TimingControlSyntax* delay, const SeparatedSyntaxList<ExpressionSyntax>& assignments, Token semi) :
        MemberSyntax(SyntaxKind::ContinuousAssign, attributes), assign(assign), strength(strength), delay(delay), assignments(assignments), semi(semi) {
        if (this->strength) this->strength->parent = this;
        if (this->delay) this->delay->parent = this;
        this->assignments.parent = this;
        for (auto child : this->assignments)
            child->parent = this;
    }